

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O3

void gen_mls16_i32(TCGContext_conflict1 *tcg_ctx,TCGv_i32 d,TCGv_i32 a,TCGv_i32 b)

{
  TCGTemp *ret;
  uintptr_t o_1;
  TCGTemp *args [2];
  TCGTemp *local_38;
  TCGTemp *local_30;
  
  ret = (TCGTemp *)(a + (long)tcg_ctx);
  local_30 = (TCGTemp *)(b + (long)tcg_ctx);
  local_38 = ret;
  tcg_gen_callN_aarch64(tcg_ctx,helper_neon_mul_u16_aarch64,ret,2,&local_38);
  local_38 = (TCGTemp *)(d + (long)tcg_ctx);
  local_30 = ret;
  tcg_gen_callN_aarch64(tcg_ctx,helper_neon_sub_u16_aarch64,local_38,2,&local_38);
  return;
}

Assistant:

static void gen_mls16_i32(TCGContext *tcg_ctx, TCGv_i32 d, TCGv_i32 a, TCGv_i32 b)
{
    gen_helper_neon_mul_u16(tcg_ctx, a, a, b);
    gen_helper_neon_sub_u16(tcg_ctx, d, d, a);
}